

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum.hpp
# Opt level: O0

int magic_enum::detail::
    reflected_min<MaxUsedAsInvalid,(magic_enum::detail::enum_subtype)0,unsigned_char>(void)

{
  uchar rhs;
  int lhs;
  
  return 0;
}

Assistant:

constexpr int reflected_min() noexcept {
  if constexpr (S == enum_subtype::flags) {
    return 0;
  } else {
    constexpr auto lhs = range_min<E>::value;
    constexpr auto rhs = (std::numeric_limits<U>::min)();

    if constexpr (cmp_less(rhs, lhs)) {
      return lhs;
    } else {
      return rhs;
    }
  }
}